

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::buildValidSubstitutionListB
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          SchemaElementDecl *subsElemDecl)

{
  GrammarResolver *pGVar1;
  SchemaElementDecl *elem_00;
  bool bVar2;
  uint key2;
  int iVar3;
  XMLCh *key1;
  undefined4 extraout_var;
  SchemaGrammar *pSVar4;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *pRVar5;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar6;
  ComplexTypeInfo *typeInfo;
  DatatypeValidator *validator;
  SchemaInfo *this_00;
  XMLCh *namespaceKey;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *subsElemList;
  SchemaGrammar *aGrammar_1;
  SchemaInfo *curRef;
  BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> importingEnum;
  SchemaGrammar *aGrammar;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *validSubsElements;
  XMLCh *chainElemName;
  SchemaElementDecl *pSStack_30;
  int chainElemURI;
  SchemaElementDecl *chainElemDecl;
  SchemaElementDecl *subsElemDecl_local;
  SchemaElementDecl *elemDecl_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  subsElemDecl_local = elemDecl;
  elemDecl_local = (SchemaElementDecl *)elem;
  elem_local = (DOMElement *)this;
  pSStack_30 = SchemaElementDecl::getSubstitutionGroupElem(subsElemDecl);
  while( true ) {
    if (pSStack_30 == (SchemaElementDecl *)0x0) {
      return;
    }
    key2 = XMLElementDecl::getURI(&pSStack_30->super_XMLElementDecl);
    key1 = XMLElementDecl::getBaseName(&pSStack_30->super_XMLElementDecl);
    aGrammar = (SchemaGrammar *)
               RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get(this->fValidSubstitutionGroups,key1,key2);
    if (aGrammar == (SchemaGrammar *)0x0) {
      if (this->fTargetNSURI == key2) {
        return;
      }
      pGVar1 = this->fGrammarResolver;
      iVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                        (this->fURIStringPool,(ulong)key2);
      pSVar4 = (SchemaGrammar *)
               GrammarResolver::getGrammar(pGVar1,(XMLCh *)CONCAT44(extraout_var,iVar3));
      if (pSVar4 == (SchemaGrammar *)0x0) {
        return;
      }
      pRVar5 = SchemaGrammar::getValidSubstitutionGroups(pSVar4);
      pVVar6 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get(pRVar5,key1,key2);
      if (pVVar6 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
        return;
      }
      aGrammar = (SchemaGrammar *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
                ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar,pVVar6);
      RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::put(this->fValidSubstitutionGroups,key1,key2,
            (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar);
    }
    bVar2 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::containsElement
                      ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar,
                       &subsElemDecl_local,0);
    elem_00 = elemDecl_local;
    if (bVar2) {
      return;
    }
    typeInfo = SchemaElementDecl::getComplexTypeInfo(subsElemDecl_local);
    validator = SchemaElementDecl::getDatatypeValidator(subsElemDecl_local);
    bVar2 = isSubstitutionGroupValid
                      (this,(DOMElement *)elem_00,pSStack_30,typeInfo,validator,(XMLCh *)0x0,false);
    if (!bVar2) break;
    ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement
              ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar,&subsElemDecl_local);
    SchemaInfo::getImportingListEnumerator
              ((BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> *)&curRef,this->fSchemaInfo);
    while (bVar2 = BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo>::hasMoreElements
                             ((BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> *)&curRef), bVar2) {
      this_00 = BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo>::nextElement
                          ((BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> *)&curRef);
      pGVar1 = this->fGrammarResolver;
      namespaceKey = SchemaInfo::getTargetNSURIString(this_00);
      pSVar4 = (SchemaGrammar *)GrammarResolver::getGrammar(pGVar1,namespaceKey);
      pRVar5 = SchemaGrammar::getValidSubstitutionGroups(pSVar4);
      pVVar6 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get(pRVar5,key1,key2);
      if ((pVVar6 != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) &&
         (bVar2 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::containsElement
                            (pVVar6,&subsElemDecl_local,0), !bVar2)) {
        ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement(pVVar6,&subsElemDecl_local);
      }
    }
    pSStack_30 = SchemaElementDecl::getSubstitutionGroupElem(pSStack_30);
    BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo>::~BaseRefVectorEnumerator
              ((BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> *)&curRef);
  }
  return;
}

Assistant:

void
TraverseSchema::buildValidSubstitutionListB(const DOMElement* const elem,
                                            SchemaElementDecl* const elemDecl,
                                            SchemaElementDecl* const subsElemDecl) {

    SchemaElementDecl* chainElemDecl = subsElemDecl->getSubstitutionGroupElem();

    while (chainElemDecl) {

        int chainElemURI = chainElemDecl->getURI();
        XMLCh* chainElemName = chainElemDecl->getBaseName();
        ValueVectorOf<SchemaElementDecl*>* validSubsElements =
            fValidSubstitutionGroups->get(chainElemName, chainElemURI);

        if (!validSubsElements) {

            if (fTargetNSURI == chainElemURI) {
                break; // an error must have occured
            }

            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(chainElemURI));

            if (!aGrammar)
                break;

            validSubsElements = aGrammar->getValidSubstitutionGroups()->get(chainElemName, chainElemURI);

            if (!validSubsElements) {
                break;
            }

            validSubsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*validSubsElements);
            fValidSubstitutionGroups->put((void*) chainElemName, chainElemURI, validSubsElements);
        }

        if (validSubsElements->containsElement(elemDecl) ||
            !isSubstitutionGroupValid(elem, chainElemDecl, elemDecl->getComplexTypeInfo(),
                                      elemDecl->getDatatypeValidator(), 0, false)) {
            break;
        }

        validSubsElements->addElement(elemDecl);

        // update related subs. info in case of circular import
        BaseRefVectorEnumerator<SchemaInfo> importingEnum = fSchemaInfo->getImportingListEnumerator();

        while (importingEnum.hasMoreElements()) {

            const SchemaInfo& curRef = importingEnum.nextElement();
            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(curRef.getTargetNSURIString());
            ValueVectorOf<SchemaElementDecl*>* subsElemList =
                aGrammar->getValidSubstitutionGroups()->get(chainElemName, chainElemURI);

            if (subsElemList && !subsElemList->containsElement(elemDecl)) {
                subsElemList->addElement(elemDecl);
            }
        }

        chainElemDecl = chainElemDecl->getSubstitutionGroupElem();
    }
}